

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O1

int fits_img_decompress(fitsfile *infptr,fitsfile *outfptr,int *status)

{
  FITSfile *pFVar1;
  void *array;
  int iVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  int datatype;
  long lVar6;
  int nrow;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined8 uVar11;
  long lVar12;
  long lVar13;
  size_t __size;
  double *nulval;
  LONGLONG LVar14;
  long lVar15;
  bool bVar16;
  int local_3fc;
  float fnulval;
  undefined4 local_3bc;
  long local_3b8;
  long local_3b0;
  long local_3a8;
  long local_3a0;
  fitsfile *local_398;
  void *local_390;
  LONGLONG local_388;
  long local_380;
  long local_378;
  long local_370;
  long local_368;
  long local_360;
  long local_358;
  long local_350;
  long local_348;
  long local_340;
  long local_338;
  long local_330;
  long local_328;
  long local_320;
  long local_318;
  long local_310;
  long local_308;
  long local_300;
  long local_2f8;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  long local_2d8;
  long local_2d0;
  long local_2c8;
  long local_2c0;
  long local_2b8;
  long local_2b0;
  long local_2a8;
  long local_2a0;
  long local_298;
  long local_290;
  undefined8 local_288;
  long local_280;
  long local_278;
  fitsfile *local_270;
  long local_268;
  long local_260;
  long ltile [6];
  long ftile [6];
  long tilesize [6];
  long naxis [6];
  long rowdim [6];
  long tlpixel [6];
  long tfpixel [6];
  double dnulval;
  LONGLONG lpixel [6];
  LONGLONG fpixel [6];
  long lpixel_1 [6];
  long fpixel_1 [6];
  
  iVar2 = fits_img_decompress_header(infptr,outfptr,status);
  if (0 < iVar2) goto LAB_001ce5f0;
  ffrdef(outfptr,status);
  ffpscl(outfptr,1.0,0.0,status);
  ffpscl(infptr,1.0,0.0,status);
  pFVar1 = infptr->Fptr;
  iVar2 = pFVar1->zbitpix;
  nulval = (double *)&fnulval;
  if (iVar2 < 8) {
    if (iVar2 == -0x40) {
      nulval = &dnulval;
      dnulval = -9.1191291391491e-36;
      local_3fc = 1;
      uVar11 = 0x52;
    }
    else if (iVar2 == -0x20) {
      fnulval = -9.11912e-36;
      local_3fc = 1;
      uVar11 = 0x2a;
    }
    else {
LAB_001ce5a2:
      uVar11 = 0;
      local_3fc = 0;
    }
  }
  else {
    local_3fc = 0;
    if (iVar2 == 8) {
      uVar11 = 0xb;
    }
    else if (iVar2 == 0x20) {
      uVar11 = 0x1f;
    }
    else {
      if (iVar2 != 0x10) goto LAB_001ce5a2;
      uVar11 = 0x15;
    }
  }
  lVar6 = (long)pFVar1->zndim;
  if (0 < lVar6) {
    memcpy(lpixel,pFVar1->znaxis,lVar6 * 8);
    lVar4 = 0;
    do {
      fpixel[lVar4] = 1;
      lVar4 = lVar4 + 1;
    } while (lVar6 != lVar4);
  }
  if (0 < *status) goto LAB_001ce5f0;
  iVar2 = fits_is_compressed_image(infptr,status);
  if (iVar2 == 0) {
    ffpmsg("CHDU is not a compressed image (fits_read_compressed_img)");
    *status = 0x19e;
    goto LAB_001ce5f0;
  }
  uVar3 = (uint)uVar11;
  if (uVar3 < 0x28) {
    if (0x1d < uVar3) {
      if ((uVar3 != 0x1e) && (uVar3 != 0x1f)) goto LAB_001ce780;
LAB_001ce74a:
      __size = infptr->Fptr->maxtilelen << 2;
LAB_001ce75a:
      local_390 = malloc(__size);
      if (((*(char *)nulval != '\0') || (*(char *)((long)nulval + 1) != '\0')) ||
         (*(char *)((long)nulval + 2) != '\0')) goto LAB_001ce7b2;
      bVar16 = *(char *)((long)nulval + 3) == '\0';
      goto LAB_001ce7a7;
    }
    if ((uVar3 != 0x14) && (uVar3 != 0x15)) goto LAB_001ce780;
    local_390 = malloc(infptr->Fptr->maxtilelen * 2);
    if (*(char *)nulval == '\0') {
      bVar16 = *(char *)((long)nulval + 1) == '\0';
      goto LAB_001ce7a7;
    }
  }
  else {
    if (uVar3 < 0x2a) {
      if ((uVar3 == 0x28) || (uVar3 == 0x29)) {
        __size = infptr->Fptr->maxtilelen << 3;
        goto LAB_001ce75a;
      }
    }
    else {
      if (uVar3 == 0x2a) goto LAB_001ce74a;
      if (uVar3 == 0x52) {
        local_390 = malloc(infptr->Fptr->maxtilelen << 3);
        if ((((*(char *)nulval == '\0') && (*(char *)((long)nulval + 1) == '\0')) &&
            (*(char *)((long)nulval + 2) == '\0')) &&
           (((*(char *)((long)nulval + 3) == '\0' && (*(char *)((long)nulval + 4) == '\0')) &&
            ((*(char *)((long)nulval + 5) == '\0' &&
             ((*(char *)((long)nulval + 6) == '\0' && (*(char *)((long)nulval + 7) == '\0')))))))) {
          local_3fc = 0;
        }
        goto LAB_001ce7b2;
      }
    }
LAB_001ce780:
    if (1 < uVar3 - 0xb) {
      ffpmsg("unsupported datatype for uncompressing image");
      *status = 0x19a;
      goto LAB_001ce5f0;
    }
    local_390 = malloc(infptr->Fptr->maxtilelen);
    bVar16 = *(char *)nulval == '\0';
LAB_001ce7a7:
    if (bVar16) {
      local_3fc = 0;
    }
  }
LAB_001ce7b2:
  if (local_390 == (void *)0x0) {
    ffpmsg("Out of memory (fits_read_compress_img)");
    *status = 0x71;
  }
  else {
    lVar6 = 0;
    do {
      naxis[lVar6] = 1;
      tilesize[lVar6] = 1;
      ftile[lVar6] = 1;
      ltile[lVar6] = 1;
      rowdim[lVar6] = 1;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 6);
    pFVar1 = infptr->Fptr;
    iVar2 = pFVar1->zndim;
    if (0 < (long)iVar2) {
      lVar6 = 1;
      lVar4 = 0;
      do {
        lVar5 = *(long *)((long)fpixel + lVar4);
        lVar13 = *(long *)((long)lpixel + lVar4);
        lVar15 = lVar13;
        if (lVar5 < lVar13) {
          lVar15 = lVar5;
        }
        if (lVar13 < lVar5) {
          lVar13 = lVar5;
        }
        *(long *)((long)fpixel_1 + lVar4) = lVar15;
        *(long *)((long)lpixel_1 + lVar4) = lVar13;
        lVar5 = *(long *)((long)pFVar1->znaxis + lVar4);
        *(long *)((long)naxis + lVar4) = lVar5;
        if (lVar15 < 1) {
          free(local_390);
          *status = 0x141;
          goto LAB_001ce5f0;
        }
        lVar13 = *(long *)((long)pFVar1->tilesize + lVar4);
        *(long *)((long)tilesize + lVar4) = lVar13;
        lVar12 = (lVar5 + -1) / lVar13 + 1;
        *(long *)((long)ftile + lVar4) = (lVar15 + -1) / lVar13 + 1;
        lVar5 = (*(long *)((long)lpixel_1 + lVar4) + -1) / lVar13 + 1;
        if (lVar12 <= lVar5) {
          lVar5 = lVar12;
        }
        *(long *)((long)ltile + lVar4) = lVar5;
        *(long *)((long)rowdim + lVar4) = lVar6;
        lVar6 = lVar6 * lVar12;
        lVar4 = lVar4 + 8;
      } while ((long)iVar2 * 8 != lVar4);
    }
    local_360 = ltile[5];
    local_398 = outfptr;
    local_270 = infptr;
    if (ftile[5] <= ltile[5]) {
      local_2a0 = ltile[0];
      local_2c0 = (ltile[0] - ftile[0]) + 1;
      iVar2 = ((int)ftile[2] + -1) * (int)rowdim[2] + ((int)ftile[3] + -1) * (int)rowdim[3] +
              ((int)ftile[4] + -1) * (int)rowdim[4] + ((int)ftile[5] + -1) * (int)rowdim[5] +
              ((int)ftile[1] + -1) * (int)rowdim[1] + (int)ftile[0];
      local_2c8 = ftile[0] * tilesize[0];
      local_298 = ftile[0];
      local_278 = tilesize[0];
      local_2d0 = (ftile[0] + -1) * tilesize[0];
      local_2d8 = -local_2d0;
      local_2d0 = local_2d0 + 1;
      local_370 = tilesize[5];
      local_378 = naxis[5];
      local_3b8 = ltile[4];
      local_340 = tilesize[4];
      local_348 = naxis[4];
      local_3b0 = ltile[3];
      local_318 = tilesize[3];
      local_320 = naxis[3];
      local_3a8 = ltile[2];
      local_2f0 = tilesize[2];
      local_2f8 = naxis[2];
      local_3a0 = ltile[1];
      local_2a8 = tilesize[1];
      local_280 = naxis[0];
      local_2b0 = naxis[1];
      lVar6 = 1;
      local_368 = ftile[4];
      local_338 = ftile[3];
      local_310 = ftile[2];
      local_2e8 = ftile[1];
      local_288 = uVar11;
      do {
        lVar4 = (ftile[5] + -1) * local_370;
        tlpixel[5] = ftile[5] * local_370;
        if (local_378 <= ftile[5] * local_370) {
          tlpixel[5] = local_378;
        }
        tfpixel[5] = lVar4 + 1;
        local_358 = ftile[5];
        if (local_368 <= local_3b8) {
          local_350 = tlpixel[5] - lVar4;
          lVar4 = local_368;
          iVar10 = iVar2;
          do {
            lVar5 = (lVar4 + -1) * local_340;
            tlpixel[4] = lVar4 * local_340;
            if (local_348 <= lVar4 * local_340) {
              tlpixel[4] = local_348;
            }
            tfpixel[4] = lVar5 + 1;
            local_330 = lVar4;
            if (ftile[3] <= local_3b0) {
              local_328 = (tlpixel[4] - lVar5) * local_350;
              iVar9 = iVar10;
              do {
                lVar4 = (ftile[3] + -1) * local_318;
                tlpixel[3] = ftile[3] * local_318;
                if (local_320 <= ftile[3] * local_318) {
                  tlpixel[3] = local_320;
                }
                tfpixel[3] = lVar4 + 1;
                local_308 = ftile[3];
                if (ftile[2] <= local_3a8) {
                  local_300 = (tlpixel[3] - lVar4) * local_328;
                  iVar8 = iVar9;
                  do {
                    lVar4 = (ftile[2] + -1) * local_2f0;
                    tlpixel[2] = ftile[2] * local_2f0;
                    if (local_2f8 <= ftile[2] * local_2f0) {
                      tlpixel[2] = local_2f8;
                    }
                    tfpixel[2] = lVar4 + 1;
                    local_2e0 = ftile[2];
                    if (ftile[1] <= local_3a0) {
                      local_2b8 = (tlpixel[2] - lVar4) * local_300;
                      iVar7 = iVar8;
                      do {
                        lVar4 = (ftile[1] + -1) * local_2a8;
                        tlpixel[1] = ftile[1] * local_2a8;
                        if (local_2b0 <= ftile[1] * local_2a8) {
                          tlpixel[1] = local_2b0;
                        }
                        tfpixel[1] = lVar4 + 1;
                        local_290 = ftile[1];
                        if (local_298 <= local_2a0) {
                          local_268 = (tlpixel[1] - lVar4) * local_2b8;
                          lVar4 = local_2c0;
                          lVar5 = local_2d8;
                          lVar13 = local_2d0;
                          lVar15 = local_2c8;
                          nrow = iVar7;
                          do {
                            array = local_390;
                            tlpixel[0] = lVar15;
                            if (local_280 < lVar15) {
                              tlpixel[0] = local_280;
                            }
                            lVar12 = (tlpixel[0] + lVar5) * local_268;
                            datatype = (int)uVar11;
                            local_388 = lVar6;
                            local_380 = lVar4;
                            local_260 = lVar13;
                            tfpixel[0] = lVar13;
                            imcomp_decompress_tile
                                      (local_270,nrow,(int)lVar12,datatype,local_3fc,nulval,
                                       local_390,(char *)0x0,&local_3bc,status);
                            LVar14 = local_388;
                            if (local_3bc == 0) {
                              ffpss(local_398,datatype,tfpixel,tlpixel,array,status);
                              LVar14 = local_388;
                            }
                            else {
                              ffppn(local_398,datatype,local_388,lVar12,array,nulval,status);
                              uVar11 = local_288;
                            }
                            lVar6 = LVar14 + lVar12;
                            nrow = nrow + 1;
                            lVar15 = lVar15 + local_278;
                            lVar5 = lVar5 - local_278;
                            lVar13 = local_260 + local_278;
                            lVar4 = local_380 + -1;
                          } while (lVar4 != 0);
                        }
                        ftile[1] = local_290 + 1;
                        iVar7 = iVar7 + (int)rowdim[1];
                      } while (local_290 != local_3a0);
                    }
                    ftile[2] = local_2e0 + 1;
                    iVar8 = iVar8 + (int)rowdim[2];
                    ftile[1] = local_2e8;
                  } while (local_2e0 != local_3a8);
                }
                ftile[3] = local_308 + 1;
                iVar9 = iVar9 + (int)rowdim[3];
                ftile[2] = local_310;
              } while (local_308 != local_3b0);
            }
            lVar4 = local_330 + 1;
            iVar10 = iVar10 + (int)rowdim[4];
            ftile[3] = local_338;
          } while (local_330 != local_3b8);
        }
        ftile[5] = local_358 + 1;
        iVar2 = iVar2 + (int)rowdim[5];
      } while (local_358 != local_360);
    }
    free(local_390);
  }
LAB_001ce5f0:
  return *status;
}

Assistant:

int fits_img_decompress (fitsfile *infptr, /* image (bintable) to uncompress */
              fitsfile *outfptr,   /* empty HDU for output uncompressed image */
              int *status)         /* IO - error status               */

/* 
  This routine decompresses the whole image and writes it to the output file.
*/

{
    int ii, datatype = 0;
    int nullcheck, anynul;
    LONGLONG fpixel[MAX_COMPRESS_DIM], lpixel[MAX_COMPRESS_DIM];
    long inc[MAX_COMPRESS_DIM];
    long imgsize;
    float *nulladdr, fnulval;
    double dnulval;

    if (fits_img_decompress_header(infptr, outfptr, status) > 0)
    {
    	return (*status);
    }

    /* force a rescan of the output header keywords, then reset the scaling */
    /* in case the BSCALE and BZERO keywords are present, so that the       */
    /* decompressed values won't be scaled when written to the output image */
    ffrdef(outfptr, status);
    ffpscl(outfptr, 1.0, 0.0, status);
    ffpscl(infptr, 1.0, 0.0, status);

    /* initialize; no null checking is needed for integer images */
    nullcheck = 0;
    nulladdr =  &fnulval;

    /* determine datatype for image */
    if ((infptr->Fptr)->zbitpix == BYTE_IMG)
    {
        datatype = TBYTE;
    }
    else if ((infptr->Fptr)->zbitpix == SHORT_IMG)
    {
        datatype = TSHORT;
    }
    else if ((infptr->Fptr)->zbitpix == LONG_IMG)
    {
        datatype = TINT;
    }
    else if ((infptr->Fptr)->zbitpix == FLOAT_IMG)
    {
        /* In the case of float images we must check for NaNs  */
        nullcheck = 1;
        fnulval = FLOATNULLVALUE;
        nulladdr =  &fnulval;
        datatype = TFLOAT;
    }
    else if ((infptr->Fptr)->zbitpix == DOUBLE_IMG)
    {
        /* In the case of double images we must check for NaNs  */
        nullcheck = 1;
        dnulval = DOUBLENULLVALUE;
        nulladdr = (float *) &dnulval;
        datatype = TDOUBLE;
    }

    /* calculate size of the image (in pixels) */
    imgsize = 1;
    for (ii = 0; ii < (infptr->Fptr)->zndim; ii++)
    {
        imgsize *= (infptr->Fptr)->znaxis[ii];
        fpixel[ii] = 1;              /* Set first and last pixel to */
        lpixel[ii] = (infptr->Fptr)->znaxis[ii]; /* include the entire image. */
        inc[ii] = 1;
    }

    /* uncompress the input image and write to output image, one tile at a time */

    fits_read_write_compressed_img(infptr, datatype, fpixel, lpixel, inc,  
            nullcheck, nulladdr, &anynul, outfptr, status);

    return (*status);
}